

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O3

Matrix * __thiscall maths::Matrix::operator/=(Matrix *this,double num)

{
  int iVar1;
  uint uVar2;
  double **ppdVar3;
  double *pdVar4;
  long lVar5;
  ulong uVar6;
  
  iVar1 = this->rows_;
  if (0 < (long)iVar1) {
    uVar2 = this->cols_;
    ppdVar3 = this->p;
    lVar5 = 0;
    do {
      if (0 < (int)uVar2) {
        pdVar4 = ppdVar3[lVar5];
        uVar6 = 0;
        do {
          pdVar4[uVar6] = pdVar4[uVar6] / num;
          uVar6 = uVar6 + 1;
        } while (uVar2 != uVar6);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != iVar1);
  }
  return this;
}

Assistant:

Matrix& Matrix::operator/=(double num)
{
    for (int i = 0; i < rows_; ++i) {
        for (int j = 0; j < cols_; ++j) {
            p[i][j] /= num;
        }
    }
    return *this;
}